

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Client::process_request
          (Client *this,Stream *strm,Request *req,Response *res,bool *connection_close)

{
  bool bVar1;
  Headers *headers;
  string local_70;
  function<bool_(unsigned_long,_unsigned_long)> local_50;
  
  write_request(this,strm,req);
  bVar1 = read_response_line(this,strm,res);
  if (!bVar1) {
    return false;
  }
  bVar1 = detail::read_headers((detail *)strm,(Stream *)&res->headers,headers);
  if (!bVar1) {
    return false;
  }
  Response::get_header_value_abi_cxx11_(&local_70,res,"Connection",0);
  bVar1 = std::operator==(&local_70,"close");
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    bVar1 = std::operator==(&res->version,"HTTP/1.0");
    std::__cxx11::string::~string((string *)&local_70);
    if (!bVar1) goto LAB_001610a1;
  }
  *connection_close = true;
LAB_001610a1:
  bVar1 = std::operator!=(&req->method,"HEAD");
  if (bVar1) {
    std::function<bool_(unsigned_long,_unsigned_long)>::function(&local_50,&req->progress);
    bVar1 = detail::read_content<httplib::Response>(strm,res,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    if (!bVar1) {
      return false;
    }
    Response::get_header_value_abi_cxx11_(&local_70,res,"Content-Encoding",0);
    bVar1 = std::operator==(&local_70,"gzip");
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

inline bool Client::process_request(Stream& strm, Request& req, Response& res, bool& connection_close)
{
    // Send request
    write_request(strm, req);

    // Receive response and headers
    if (!read_response_line(strm, res) || !detail::read_headers(strm, res.headers)) {
        return false;
    }

    if (res.get_header_value("Connection") == "close" || res.version == "HTTP/1.0") {
        connection_close = true;
    }

    // Body
    if (req.method != "HEAD") {
        if (!detail::read_content(strm, res, req.progress)) {
            return false;
        }

        if (res.get_header_value("Content-Encoding") == "gzip") {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
            detail::decompress(res.body);
#else
            return false;
#endif
        }
    }

    return true;
}